

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

Visibility eglu::getWindowVisibility(WindowVisibility visibility)

{
  undefined4 local_c;
  WindowVisibility visibility_local;
  
  if (visibility == WINDOWVISIBILITY_WINDOWED) {
    local_c = VISIBILITY_VISIBLE;
  }
  else if (visibility == WINDOWVISIBILITY_FULLSCREEN) {
    local_c = VISIBILITY_FULLSCREEN;
  }
  else if (visibility == WINDOWVISIBILITY_HIDDEN) {
    local_c = VISIBILITY_HIDDEN;
  }
  else {
    local_c = VISIBILITY_DONT_CARE;
  }
  return local_c;
}

Assistant:

static WindowParams::Visibility getWindowVisibility (tcu::WindowVisibility visibility)
{
	switch (visibility)
	{
		case tcu::WINDOWVISIBILITY_WINDOWED:	return WindowParams::VISIBILITY_VISIBLE;
		case tcu::WINDOWVISIBILITY_FULLSCREEN:	return WindowParams::VISIBILITY_FULLSCREEN;
		case tcu::WINDOWVISIBILITY_HIDDEN:		return WindowParams::VISIBILITY_HIDDEN;

		default:
			DE_ASSERT(false);
			return WindowParams::VISIBILITY_DONT_CARE;
	}
}